

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axis_property.c
# Opt level: O0

void mpt_axis_init(mpt_axis *ax,mpt_axis *from)

{
  char *pcVar1;
  mpt_axis *from_local;
  mpt_axis *ax_local;
  
  if (from == (mpt_axis *)0x0) {
    memcpy(ax,&def_axis,0x28);
  }
  else {
    memcpy(ax,from,0x28);
    if (ax->_title != (char *)0x0) {
      pcVar1 = strdup(from->_title);
      ax->_title = pcVar1;
    }
  }
  return;
}

Assistant:

extern void mpt_axis_init(MPT_STRUCT(axis) *ax, const MPT_STRUCT(axis) *from)
{
	if (from) {
		*ax = *from;
		
		if (ax->_title) {
			ax->_title = strdup(from->_title);
		}
		return;
	}
	*ax = def_axis;
}